

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WindowImplX11.cpp
# Opt level: O0

void __thiscall sf::priv::WindowImplX11::setMouseCursorGrabbed(WindowImplX11 *this,bool grabbed)

{
  int iVar1;
  Time TVar2;
  ostream *poVar3;
  byte in_SIL;
  long in_RDI;
  int result;
  uint trial;
  undefined8 uVar4;
  uint local_10;
  
  if (((*(byte *)(in_RDI + 0x425) & 1) == 0) && ((*(byte *)(in_RDI + 0x426) & 1) != (in_SIL & 1))) {
    if ((in_SIL & 1) == 0) {
      XUngrabPointer(*(undefined8 *)(in_RDI + 0x3d0),0);
      *(undefined1 *)(in_RDI + 0x426) = 0;
    }
    else {
      for (local_10 = 0; local_10 < 5; local_10 = local_10 + 1) {
        uVar4 = *(undefined8 *)(in_RDI + 0x3c8);
        iVar1 = XGrabPointer(*(undefined8 *)(in_RDI + 0x3d0),*(undefined8 *)(in_RDI + 0x3c8),1,0,1,1
                             ,uVar4,0,0);
        if (iVar1 == 0) {
          *(undefined1 *)(in_RDI + 0x426) = 1;
          break;
        }
        TVar2 = milliseconds((Int32)((ulong)uVar4 >> 0x20));
        sleep((uint)TVar2.m_microseconds);
      }
      if ((*(byte *)(in_RDI + 0x426) & 1) == 0) {
        poVar3 = err();
        poVar3 = std::operator<<(poVar3,"Failed to grab mouse cursor");
        std::ostream::operator<<(poVar3,std::endl<char,std::char_traits<char>>);
      }
    }
  }
  return;
}

Assistant:

void WindowImplX11::setMouseCursorGrabbed(bool grabbed)
{
    using namespace WindowsImplX11Impl;

    // This has no effect in fullscreen mode
    if (m_fullscreen || (m_cursorGrabbed == grabbed))
        return;

    if (grabbed)
    {
        // Try multiple times to grab the cursor
        for (unsigned int trial = 0; trial < maxTrialsCount; ++trial)
        {
            int result = XGrabPointer(m_display, m_window, True, None, GrabModeAsync, GrabModeAsync, m_window, None, CurrentTime);

            if (result == GrabSuccess)
            {
                m_cursorGrabbed = true;
                break;
            }

            // The cursor grab failed, trying again after a small sleep
            sf::sleep(sf::milliseconds(50));
        }

        if (!m_cursorGrabbed)
            err() << "Failed to grab mouse cursor" << std::endl;
    }
    else
    {
        // Release the cursor from the window and disable cursor grabbing
        XUngrabPointer(m_display, CurrentTime);
        m_cursorGrabbed = false;
    }
}